

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  reference __k;
  mapped_type_conflict1 *pmVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  undefined1 local_2f8 [8];
  string ignoreExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string ignoreExtensionsVar;
  key_type local_220;
  allocator local_1f9;
  key_type local_1f8;
  char *local_1d8;
  char *outputExtension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string outputExtensionVar;
  string msg;
  int preference;
  char *linkerPref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string linkerPrefVar;
  _Self local_28;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  string *l_local;
  cmGlobalGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)l;
  l_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->LanguageToLinkerPreference,l);
  linkerPrefVar.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->LanguageToLinkerPreference);
  bVar2 = std::operator!=(&local_28,(_Self *)((long)&linkerPrefVar.field_2 + 8));
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CMAKE_",&local_91);
    std::__cxx11::string::string((string *)&local_c8,(string *)mf_local);
    std::operator+(&local_70,&local_90,&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"_LINKER_PREFERENCE",(allocator *)((long)&linkerPref + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&linkerPref + 7));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar4 = cmMakefile::GetDefinition(local_20,(string *)local_50);
    msg.field_2._12_4_ = 0;
    if ((pcVar4 != (char *)0x0) &&
       (iVar3 = __isoc99_sscanf(pcVar4,"%d",(undefined1 *)((long)&msg.field_2 + 0xc)), iVar3 != 1))
    {
      if (*pcVar4 == 'P') {
        msg.field_2._12_4_ = 100;
      }
      else {
        msg.field_2._12_4_ = 0;
      }
    }
    if ((int)msg.field_2._12_4_ < 0) {
      std::__cxx11::string::string
                ((string *)(outputExtensionVar.field_2._M_local_buf + 8),(string *)local_50);
      std::__cxx11::string::operator+=
                ((string *)(outputExtensionVar.field_2._M_local_buf + 8),
                 " is negative, adjusting it to 0");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar4,"Warning");
      msg.field_2._12_4_ = 0;
      std::__cxx11::string::~string((string *)(outputExtensionVar.field_2._M_local_buf + 8));
    }
    uVar1 = msg.field_2._12_4_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->LanguageToLinkerPreference,(key_type *)mf_local);
    *pmVar5 = uVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"CMAKE_",&local_181);
    std::__cxx11::string::string((string *)&local_1a8,(string *)mf_local);
    std::operator+(&local_160,&local_180,&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c8,"_OUTPUT_EXTENSION",(allocator *)((long)&outputExtension + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   &local_160,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&outputExtension + 7));
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    pcVar4 = cmMakefile::GetDefinition(local_20,(string *)local_140);
    local_1d8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->LanguageToOutputExtension,(key_type *)mf_local);
      std::__cxx11::string::operator=((string *)pmVar6,pcVar4);
      pcVar4 = local_1d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,pcVar4,&local_1f9);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,&local_1f8);
      std::__cxx11::string::operator=((string *)pmVar6,pcVar4);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      if (*local_1d8 == '.') {
        pcVar4 = local_1d8 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_220,pcVar4,
                   (allocator *)(ignoreExtensionsVar.field_2._M_local_buf + 0xf));
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->OutputExtensions,&local_220);
        std::__cxx11::string::operator=((string *)pmVar6,pcVar4);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(ignoreExtensionsVar.field_2._M_local_buf + 0xf));
      }
    }
    FillExtensionToLanguageMap(this,(string *)mf_local,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"CMAKE_",&local_289);
    std::__cxx11::string::string((string *)&local_2b0,(string *)mf_local);
    std::operator+(&local_268,&local_288,&local_2b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2d0,"_IGNORE_EXTENSIONS",
               (allocator *)(ignoreExts.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   &local_268,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)(ignoreExts.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    pcVar4 = cmMakefile::GetSafeDefinition(local_20,(string *)local_248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2f8,pcVar4,
               (allocator *)
               ((long)&extensionList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extensionList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    cmSystemTools::ExpandListArgument
              ((string *)local_2f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,false);
    local_320._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      local_328._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar2 = __gnu_cxx::operator!=(&local_320,&local_328);
      if (!bVar2) break;
      __k = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_320);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&this->IgnoreExtensions,__k);
      *pmVar7 = true;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_320);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (this->LanguageToLinkerPreference.find(l) !=
                                        this->LanguageToLinkerPreference.end())
    {
    return;
    }

  std::string linkerPrefVar = std::string("CMAKE_") +
    std::string(l) + std::string("_LINKER_PREFERENCE");
  const char* linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if(linkerPref)
    {
    if (sscanf(linkerPref, "%d", &preference)!=1)
      {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if (linkerPref[0]=='P')
        {
        preference = 100;
        }
      else
        {
        preference = 0;
        }
      }
    }

  if (preference < 0)
    {
    std::string msg = linkerPrefVar;
    msg += " is negative, adjusting it to 0";
    cmSystemTools::Message(msg.c_str(), "Warning");
    preference = 0;
    }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = std::string("CMAKE_") +
    std::string(l) + std::string("_OUTPUT_EXTENSION");
  const char* outputExtension = mf->GetDefinition(outputExtensionVar);
  if(outputExtension)
    {
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if(outputExtension[0] == '.')
      {
      this->OutputExtensions[outputExtension+1] = outputExtension+1;
      }
    }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar = std::string("CMAKE_") +
    std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(ignoreExts, extensionList);
  for(std::vector<std::string>::iterator i = extensionList.begin();
      i != extensionList.end(); ++i)
    {
    this->IgnoreExtensions[*i] = true;
    }

}